

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O2

FT_Pointer ft_mem_dup(FT_Memory memory,void *address,FT_ULong size,FT_Error *p_error)

{
  undefined8 in_RAX;
  FT_Pointer __dest;
  FT_Error error;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  __dest = ft_mem_qalloc(memory,size,&local_34);
  if (address != (void *)0x0 && local_34 == 0) {
    memcpy(__dest,address,size);
  }
  *p_error = local_34;
  return __dest;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_dup( FT_Memory    memory,
              const void*  address,
              FT_ULong     size,
              FT_Error    *p_error )
  {
    FT_Error    error;
    FT_Pointer  p = ft_mem_qalloc( memory, (FT_Long)size, &error );


    if ( !error && address )
      ft_memcpy( p, address, size );

    *p_error = error;
    return p;
  }